

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O1

RefCntWeakPtr<Diligent::DeviceContextVkImpl> * __thiscall
Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>::operator=
          (RefCntWeakPtr<Diligent::DeviceContextVkImpl> *this,DeviceContextVkImpl *pObj)

{
  RefCntWeakPtr<Diligent::DeviceContextVkImpl> local_28;
  
  RefCntWeakPtr(&local_28,pObj);
  if (this->m_pRefCounters != local_28.m_pRefCounters) {
    Release(this);
    this->m_pObject = local_28.m_pObject;
    this->m_pRefCounters = local_28.m_pRefCounters;
    local_28.m_pRefCounters = (RefCountersImpl *)0x0;
    local_28.m_pObject = (DeviceContextVkImpl *)0x0;
  }
  Release(&local_28);
  return this;
}

Assistant:

RefCntWeakPtr& operator=(T* pObj) noexcept
    {
        return operator=(RefCntWeakPtr(pObj));
    }